

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O1

QString * __thiscall
QWizard::buttonText(QString *__return_storage_ptr__,QWizard *this,WizardButton which)

{
  QWizardPrivate *this_00;
  bool bVar1;
  QWizardPrivate *in_RCX;
  long in_FS_OFFSET;
  QString local_48;
  WizardButton local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWizardPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  bVar1 = QWizardPrivate::ensureButton(this_00,which);
  if (bVar1) {
    local_48.d.d = (Data *)CONCAT44(local_48.d.d._4_4_,which);
    bVar1 = QMap<int,_QString>::contains(&this_00->buttonCustomTexts,(int *)&local_48);
    if (bVar1) {
      local_48.d.d = (Data *)0x0;
      local_48.d.ptr = (char16_t *)0x0;
      local_48.d.size = 0;
      local_2c = which;
      QMap<int,_QString>::value
                (__return_storage_ptr__,&this_00->buttonCustomTexts,&local_2c,&local_48);
    }
    else {
      local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_48.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      buttonDefaultText(&local_48,this_00->wizStyle,which,in_RCX);
      if (local_48.d.ptr == (char16_t *)0x0) {
        QAbstractButton::text
                  (__return_storage_ptr__,
                   *(QAbstractButton **)((long)&this_00->field_20 + (long)which * 8));
      }
      else {
        (__return_storage_ptr__->d).d = local_48.d.d;
        (__return_storage_ptr__->d).ptr = local_48.d.ptr;
        (__return_storage_ptr__->d).size = local_48.d.size;
        if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
      }
    }
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
LAB_00517ec5:
      __stack_chk_fail();
    }
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) goto LAB_00517ec5;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

QString QWizard::buttonText(WizardButton which) const
{
    Q_D(const QWizard);

    if (!d->ensureButton(which))
        return QString();

    if (d->buttonCustomTexts.contains(which))
        return d->buttonCustomTexts.value(which);

    const QString defText = buttonDefaultText(d->wizStyle, which, d);
    if (!defText.isNull())
        return defText;

    return d->btns[which]->text();
}